

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::DeepScanLineInputFile::Data::readData
          (Data *this,DeepFrameBuffer *fb,int scanLine1,int scanLine2,bool countsOnly)

{
  bool bVar1;
  exr_result_t eVar2;
  ostream *poVar3;
  char *pcVar4;
  undefined8 uVar5;
  void *pvVar6;
  int in_ECX;
  int in_EDX;
  long in_RDI;
  byte in_R8B;
  int y_1;
  bool redo;
  ScanLineProcess sp;
  int y;
  TaskGroup tg;
  ScanLineProcessGroup sg;
  int64_t nchunks;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  int32_t scansperchunk;
  exr_chunk_info_t cinfo;
  exr_attr_box2i_t dw;
  stringstream *in_stack_fffffffffffff908;
  int in_stack_fffffffffffff910;
  int in_stack_fffffffffffff914;
  undefined4 in_stack_fffffffffffff918;
  undefined4 in_stack_fffffffffffff91c;
  ProcessGroup<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_true> *in_stack_fffffffffffff920;
  undefined4 in_stack_fffffffffffff928;
  undefined8 in_stack_fffffffffffff930;
  exr_const_context_t in_stack_fffffffffffff938;
  int in_stack_fffffffffffff940;
  int in_stack_fffffffffffff944;
  DeepFrameBuffer *in_stack_fffffffffffff948;
  Data *in_stack_fffffffffffff950;
  exr_const_context_t in_stack_fffffffffffff958;
  ScanLineProcess *in_stack_fffffffffffff960;
  vector<Imf_3_3::DeepSlice,_std::allocator<Imf_3_3::DeepSlice>_> *in_stack_fffffffffffff970;
  undefined8 in_stack_fffffffffffff978;
  exr_chunk_info_t *in_stack_fffffffffffff988;
  undefined8 in_stack_fffffffffffff990;
  exr_const_context_t in_stack_fffffffffffff998;
  int local_650;
  int local_648;
  byte local_643;
  ulong local_640;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  Context *in_stack_fffffffffffffab0;
  int in_stack_fffffffffffffadc;
  Context *in_stack_fffffffffffffae0;
  int local_3fc;
  stringstream local_398 [16];
  ostream local_388 [392];
  stringstream local_200 [16];
  ostream local_1f0 [380];
  int local_74;
  uint local_70;
  int iStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  exr_attr_box2i_t local_29;
  byte local_19;
  int local_18;
  int local_14 [5];
  
  local_19 = in_R8B & 1;
  local_18 = in_ECX;
  local_14[0] = in_EDX;
  local_29 = Context::dataWindow(in_stack_fffffffffffffae0,in_stack_fffffffffffffadc);
  local_74 = 1;
  Context::operator_cast_to__priv_exr_context_t_((Context *)0xa78c8a);
  eVar2 = exr_get_scanlines_per_chunk
                    ((exr_const_context_t)
                     CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918),
                     in_stack_fffffffffffff914,(int32_t *)in_stack_fffffffffffff908);
  if (eVar2 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_200);
    poVar3 = std::operator<<(local_1f0,"Error querying scanline counts from image file \"");
    pcVar4 = Context::fileName(in_stack_fffffffffffffab0);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::operator<<(poVar3,"\".");
    uVar5 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc
              ((ArgExc *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
               in_stack_fffffffffffff908);
    __cxa_throw(uVar5,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  if (local_18 < local_14[0]) {
    std::swap<int>(local_14,&local_18);
  }
  if ((local_29.min.y <= local_14[0]) && (local_18 <= local_29.max.y)) {
    if ((((long)local_18 - (long)local_14[0]) / (long)local_74 + 1 < 2) ||
       (*(int *)(in_RDI + 0xc) < 2)) {
      anon_unknown_12::ScanLineProcess::ScanLineProcess((ScanLineProcess *)&local_648);
      bVar1 = true;
      local_643 = local_19 & 1;
      local_650 = local_14[0];
      while (local_650 <= local_18) {
        Context::operator_cast_to__priv_exr_context_t_((Context *)0xa79260);
        eVar2 = exr_read_scanline_chunk_info
                          (in_stack_fffffffffffff998,(int)((ulong)in_stack_fffffffffffff990 >> 0x20)
                           ,(int)in_stack_fffffffffffff990,in_stack_fffffffffffff988);
        if (eVar2 != 0) {
          uVar5 = __cxa_allocate_exception(0x48);
          Iex_3_3::InputExc::InputExc
                    ((InputExc *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                     (char *)in_stack_fffffffffffff908);
          __cxa_throw(uVar5,&Iex_3_3::InputExc::typeinfo,Iex_3_3::InputExc::~InputExc);
        }
        if (((bVar1) || ((uint)local_640 != local_70)) || (local_648 != 0)) {
          local_640 = (ulong)local_70;
          local_610 = local_40;
          uStack_608 = uStack_38;
          local_620 = local_50;
          uStack_618 = uStack_48;
          local_630 = local_60;
          uStack_628 = uStack_58;
          Context::operator_cast_to__priv_exr_context_t_((Context *)0xa793d9);
          in_stack_fffffffffffff908 = (stringstream *)(in_RDI + 0xc0);
          anon_unknown_12::ScanLineProcess::run_decode
                    (in_stack_fffffffffffff960,in_stack_fffffffffffff958,
                     (int)((ulong)in_stack_fffffffffffff950 >> 0x20),in_stack_fffffffffffff948,
                     in_stack_fffffffffffff944,in_stack_fffffffffffff940,in_stack_fffffffffffff970);
          bVar1 = false;
        }
        else {
          Context::operator_cast_to__priv_exr_context_t_((Context *)0xa79342);
          in_stack_fffffffffffff908 = (stringstream *)(in_RDI + 0xc0);
          anon_unknown_12::ScanLineProcess::run_unpack
                    ((ScanLineProcess *)
                     CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                     in_stack_fffffffffffff938,(int)((ulong)in_stack_fffffffffffff930 >> 0x20),
                     (DeepFrameBuffer *)CONCAT44(eVar2,in_stack_fffffffffffff928),
                     (int)((ulong)in_stack_fffffffffffff920 >> 0x20),(int)in_stack_fffffffffffff920,
                     (vector<Imf_3_3::DeepSlice,_std::allocator<Imf_3_3::DeepSlice>_> *)
                     in_stack_fffffffffffff950);
        }
        local_650 = local_74 + iStack_68;
      }
      anon_unknown_12::ScanLineProcess::~ScanLineProcess
                ((ScanLineProcess *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
    }
    else {
      IlmThread_3_3::ProcessGroup<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_true>::
      ProcessGroup((ProcessGroup<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_true> *)
                   CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                   (uint)((ulong)in_stack_fffffffffffff938 >> 0x20));
      IlmThread_3_3::TaskGroup::TaskGroup((TaskGroup *)in_stack_fffffffffffff920);
      local_3fc = local_14[0];
      while (local_3fc <= local_18) {
        Context::operator_cast_to__priv_exr_context_t_((Context *)0xa7902a);
        eVar2 = exr_read_scanline_chunk_info
                          (in_stack_fffffffffffff998,(int)((ulong)in_stack_fffffffffffff990 >> 0x20)
                           ,(int)in_stack_fffffffffffff990,in_stack_fffffffffffff988);
        if (eVar2 != 0) {
          uVar5 = __cxa_allocate_exception(0x48);
          Iex_3_3::InputExc::InputExc
                    ((InputExc *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                     (char *)in_stack_fffffffffffff908);
          __cxa_throw(uVar5,&Iex_3_3::InputExc::typeinfo,Iex_3_3::InputExc::~InputExc);
        }
        pvVar6 = operator_new(0x38);
        in_stack_fffffffffffff908 =
             (stringstream *)CONCAT44((int)((ulong)in_stack_fffffffffffff908 >> 0x20),local_3fc);
        in_stack_fffffffffffff910 = local_18;
        LineBufferTask::LineBufferTask
                  ((LineBufferTask *)in_stack_fffffffffffff960,
                   (TaskGroup *)in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                   (ScanLineProcessGroup *)in_stack_fffffffffffff948,
                   (DeepFrameBuffer *)CONCAT44(eVar2,in_stack_fffffffffffff940),
                   (exr_chunk_info_t *)in_stack_fffffffffffff938,(int)in_stack_fffffffffffff970,
                   (int)in_stack_fffffffffffff978,SUB81((ulong)pvVar6 >> 0x38,0));
        IlmThread_3_3::ThreadPool::addGlobalTask((Task *)0xa7916b);
        local_3fc = local_74 + iStack_68;
      }
      IlmThread_3_3::TaskGroup::~TaskGroup
                ((TaskGroup *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
      IlmThread_3_3::ProcessGroup<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_true>::
      throw_on_failure((ProcessGroup<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_true> *)
                       in_stack_fffffffffffff950);
      IlmThread_3_3::ProcessGroup<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_true>::
      ~ProcessGroup(in_stack_fffffffffffff920);
    }
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_398);
  poVar3 = std::operator<<(local_388,
                           "Tried to read scan line outside the image file\'s data window: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_14[0]);
  poVar3 = std::operator<<(poVar3," - ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
  poVar3 = std::operator<<(poVar3," vs datawindow ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_29.min.y);
  poVar3 = std::operator<<(poVar3," - ");
  std::ostream::operator<<(poVar3,local_29.max.y);
  uVar5 = __cxa_allocate_exception(0x48);
  Iex_3_3::ArgExc::ArgExc
            ((ArgExc *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
             in_stack_fffffffffffff908);
  __cxa_throw(uVar5,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
}

Assistant:

void
DeepScanLineInputFile::Data::readData (
    const DeepFrameBuffer &fb, int scanLine1, int scanLine2, bool countsOnly)
{
    exr_attr_box2i_t dw = _ctxt->dataWindow (partNumber);
    exr_chunk_info_t cinfo;
    int32_t          scansperchunk = 1;

    if (EXR_ERR_SUCCESS != exr_get_scanlines_per_chunk (*_ctxt, partNumber, &scansperchunk))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Error querying scanline counts from image "
            "file \"" << _ctxt->fileName () << "\".");
    }

    if (scanLine2 < scanLine1)
        std::swap (scanLine1, scanLine2);

    if (scanLine1 < dw.min.y || scanLine2 > dw.max.y)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Tried to read scan line outside "
            "the image file's data window: "
            << scanLine1 << " - " << scanLine2
            << " vs datawindow "
            << dw.min.y << " - " << dw.max.y);
    }

#if ILMTHREAD_THREADING_ENABLED
    int64_t nchunks;
    nchunks = ((int64_t) scanLine2 - (int64_t) scanLine1);
    nchunks /= (int64_t) scansperchunk;
    nchunks += 1;

    if (nchunks > 1 && numThreads > 1)
    {
        // we need the lifetime of this to last longer than the
        // lifetime of the task group below such that we don't get use
        // after free type error, so use scope rules to accomplish
        // this
        ScanLineProcessGroup sg (numThreads);

        {
            ILMTHREAD_NAMESPACE::TaskGroup tg;

            for (int y = scanLine1; y <= scanLine2; )
            {
                if (EXR_ERR_SUCCESS != exr_read_scanline_chunk_info (*_ctxt, partNumber, y, &cinfo))
                    throw IEX_NAMESPACE::InputExc ("Unable to query scanline information");

                ILMTHREAD_NAMESPACE::ThreadPool::addGlobalTask (
                    new LineBufferTask (&tg, this, &sg, &fb, cinfo, y, scanLine2, countsOnly) );

                y += scansperchunk - (y - cinfo.start_y);
            }
        }

        sg.throw_on_failure ();
    }
    else
#endif
    {
        ScanLineProcess sp;
        bool redo = true;

        sp.counts_only = countsOnly;
        for (int y = scanLine1; y <= scanLine2; )
        {
            if (EXR_ERR_SUCCESS != exr_read_scanline_chunk_info (*_ctxt, partNumber, y, &cinfo))
                throw IEX_NAMESPACE::InputExc ("Unable to query scanline information");

            // Check if we have the same chunk where we can just
            // re-run the unpack (i.e. people reading 1 scan at a time
            // in a multi-scanline chunk)
            if (!redo &&
                sp.cinfo.idx == cinfo.idx &&
                sp.last_decode_err == EXR_ERR_SUCCESS)
            {
                sp.run_unpack (
                    *_ctxt,
                    partNumber,
                    &fb,
                    y,
                    scanLine2,
                    fill_list);
            }
            else
            {
                sp.cinfo = cinfo;
                sp.run_decode (
                    *_ctxt,
                    partNumber,
                    &fb,
                    y,
                    scanLine2,
                    fill_list);
                redo = false;
            }

            y += scansperchunk - (y - cinfo.start_y);
        }
    }
}